

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_storedIdentityHash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  size_t value;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(*arguments);
  if (_Var1) {
    context_local =
         (sysbvm_context_t *)
         sysbvm_tuple_size_encode(context,(ulong)(*(uint *)(*arguments + 8) >> 10));
  }
  else {
    value = sysbvm_hashMultiply(*arguments);
    context_local = (sysbvm_context_t *)sysbvm_tuple_size_encode(context,value);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_storedIdentityHash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    if(sysbvm_tuple_isNonNullPointer(arguments[0]))
        return sysbvm_tuple_size_encode(context, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(arguments[0])->header.identityHashAndFlags >> SYSBVM_TUPLE_IDENTITY_HASH_SHIFT);

    return sysbvm_tuple_size_encode(context, sysbvm_hashMultiply(arguments[0]));
}